

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  int i;
  int iVar2;
  ImGuiPopupData *pIVar3;
  int i_00;
  int n;
  ImVector<ImGuiPopupData> *this;
  
  iVar2 = (GImGui->OpenPopupStack).Size;
  if (iVar2 != 0) {
    if (ref_window == (ImGuiWindow *)0x0) {
      i_00 = 0;
    }
    else {
      this = &GImGui->OpenPopupStack;
      for (i_00 = 0; i_00 < iVar2; i_00 = i_00 + 1) {
        pIVar3 = ImVector<ImGuiPopupData>::operator[](this,i_00);
        if (pIVar3->Window != (ImGuiWindow *)0x0) {
          uVar1 = pIVar3->Window->Flags;
          if ((uVar1 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                          ,0x1f3b,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          i = i_00;
          if ((uVar1 >> 0x18 & 1) == 0) {
            while( true ) {
              iVar2 = this->Size;
              if (iVar2 <= i) goto LAB_00171fb9;
              pIVar3 = ImVector<ImGuiPopupData>::operator[](this,i);
              if ((pIVar3->Window != (ImGuiWindow *)0x0) &&
                 (pIVar3->Window->RootWindow == ref_window->RootWindow)) break;
              i = i + 1;
            }
          }
        }
        iVar2 = this->Size;
      }
    }
LAB_00171fb9:
    if (i_00 < iVar2) {
      ClosePopupToLevel(i_00,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}